

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

FT_Error ps_table_add(PS_Table table,FT_Int idx,void *object,FT_UInt length)

{
  FT_Byte **ppFVar1;
  ulong uVar2;
  FT_Byte *pFVar3;
  FT_Byte **ppFVar4;
  ulong uVar5;
  ulong uVar6;
  FT_Offset FVar7;
  FT_Byte *pFVar8;
  ulong uVar9;
  FT_Error FVar10;
  ulong __n;
  ulong size;
  int local_64;
  FT_Byte *local_60;
  FT_Memory local_58;
  ulong local_50;
  ulong local_48;
  FT_Byte *local_40;
  FT_UInt local_34;
  
  FVar10 = 6;
  if ((-1 < idx) && (idx < table->max_elems)) {
    pFVar8 = table->block;
    FVar7 = table->cursor;
    __n = (ulong)length;
    uVar2 = table->capacity;
    if (uVar2 < FVar7 + __n) {
      uVar6 = (long)object - (long)pFVar8;
      size = uVar2;
      uVar5 = 0xffffffffffffffff;
      if (-1 < (long)uVar6) {
        uVar5 = uVar6;
      }
      do {
        size = size + (size >> 2) + 0x400 & 0xfffffffffffffc00;
      } while (size < FVar7 + __n);
      uVar9 = 0xffffffffffffffff;
      if (uVar6 < uVar2) {
        uVar9 = uVar5;
      }
      local_58 = table->memory;
      local_60 = (FT_Byte *)object;
      local_50 = __n;
      local_40 = pFVar8;
      local_34 = length;
      pFVar3 = (FT_Byte *)ft_mem_alloc(local_58,size,&local_64);
      pFVar8 = local_40;
      table->block = pFVar3;
      if (local_64 != 0) {
        table->block = local_40;
        return local_64;
      }
      local_48 = uVar9;
      if (local_40 != (FT_Byte *)0x0) {
        memcpy(pFVar3,local_40,table->capacity);
        if (0 < (long)table->max_elems) {
          pFVar3 = table->block;
          ppFVar4 = table->elements;
          ppFVar1 = ppFVar4 + table->max_elems;
          do {
            if (*ppFVar4 != (FT_Byte *)0x0) {
              *ppFVar4 = *ppFVar4 + ((long)pFVar3 - (long)pFVar8);
            }
            ppFVar4 = ppFVar4 + 1;
          } while (ppFVar4 < ppFVar1);
        }
        ft_mem_free(local_58,pFVar8);
      }
      table->capacity = size;
      object = local_60;
      if (-1 < (long)local_48) {
        object = table->block + local_48;
      }
      pFVar8 = table->block;
      FVar7 = table->cursor;
      __n = local_50;
      length = local_34;
    }
    table->elements[(uint)idx] = pFVar8 + FVar7;
    table->lengths[(uint)idx] = length;
    memcpy(table->block + FVar7,object,__n);
    table->cursor = table->cursor + __n;
    FVar10 = 0;
  }
  return FVar10;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_table_add( PS_Table  table,
                FT_Int    idx,
                void*     object,
                FT_UInt   length )
  {
    if ( idx < 0 || idx >= table->max_elems )
    {
      FT_ERROR(( "ps_table_add: invalid index\n" ));
      return FT_THROW( Invalid_Argument );
    }

    /* grow the base block if needed */
    if ( table->cursor + length > table->capacity )
    {
      FT_Error    error;
      FT_Offset   new_size = table->capacity;
      FT_PtrDist  in_offset;


      in_offset = (FT_Byte*)object - table->block;
      if ( in_offset < 0 || (FT_Offset)in_offset >= table->capacity )
        in_offset = -1;

      while ( new_size < table->cursor + length )
      {
        /* increase size by 25% and round up to the nearest multiple
           of 1024 */
        new_size += ( new_size >> 2 ) + 1;
        new_size  = FT_PAD_CEIL( new_size, 1024 );
      }

      error = reallocate_t1_table( table, new_size );
      if ( error )
        return error;

      if ( in_offset >= 0 )
        object = table->block + in_offset;
    }

    /* add the object to the base block and adjust offset */
    table->elements[idx] = table->block + table->cursor;
    table->lengths [idx] = length;
    FT_MEM_COPY( table->block + table->cursor, object, length );

    table->cursor += length;
    return FT_Err_Ok;
  }